

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O1

int EVP_DecodeBase64(uint8_t *out,size_t *out_len,size_t max_out,uint8_t *in,size_t in_len)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  size_t num_bytes_resulting;
  size_t local_38;
  
  *out_len = 0;
  iVar1 = 0;
  if (((in_len & 3) == 0) && (iVar1 = 0, (in_len >> 2) * 3 <= max_out)) {
    if (in_len == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = 0;
      uVar3 = 0;
      do {
        iVar1 = base64_decode_quad(out,&local_38,in + uVar3);
        if (iVar1 != 0) {
          sVar2 = sVar2 + local_38;
          out = out + local_38;
        }
        if (iVar1 == 0 || in_len - 4 != uVar3 && local_38 != 3) {
          return 0;
        }
        uVar3 = uVar3 + 4;
      } while (uVar3 < in_len);
    }
    *out_len = sVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int EVP_DecodeBase64(uint8_t *out, size_t *out_len, size_t max_out,
                     const uint8_t *in, size_t in_len) {
  *out_len = 0;

  if (in_len % 4 != 0) {
    return 0;
  }

  size_t max_len;
  if (!EVP_DecodedLength(&max_len, in_len) || max_out < max_len) {
    return 0;
  }

  size_t i, bytes_out = 0;
  for (i = 0; i < in_len; i += 4) {
    size_t num_bytes_resulting;

    if (!base64_decode_quad(out, &num_bytes_resulting, &in[i])) {
      return 0;
    }

    bytes_out += num_bytes_resulting;
    out += num_bytes_resulting;
    if (num_bytes_resulting != 3 && i != in_len - 4) {
      return 0;
    }
  }

  *out_len = bytes_out;
  return 1;
}